

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guarded.hpp
# Opt level: O0

conditional_t<std::is_copy_assignable<pair<bool,_bool>_>::value,_std::pair<bool,_bool>,_void>
__thiscall
gmlc::libguarded::guarded<std::pair<bool,_bool>,_std::mutex>::load
          (guarded<std::pair<bool,_bool>,_std::mutex> *this)

{
  conditional_t<std::is_copy_assignable<pair<bool,_bool>_>::value,_std::pair<bool,_bool>,_void>
  cVar1;
  conditional_t<std::is_copy_assignable<pair<bool,_bool>_>::value,_std::pair<bool,_bool>,_void>
  *in_RDI;
  lock_guard<std::mutex> glock;
  conditional_t<std::is_copy_assignable<pair<bool,_bool>_>::value,_std::pair<bool,_bool>,_void>
  retObj;
  mutex_type *in_stack_ffffffffffffffd8;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffffd8);
  cVar1 = *in_RDI;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x452c78);
  return cVar1;
}

Assistant:

std::conditional_t<std::is_copy_assignable<T>::value, T, void> load()
    {
        std::lock_guard<M> glock(m_mutex);
        auto retObj =
            std::conditional_t<std::is_copy_assignable<T>::value, T, void>(
                m_obj);
        return retObj;
    }